

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpknl(fitsfile *fptr,char *keyroot,int nstart,int nkey,int *value,char **comm,int *status)

{
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  int local_f0;
  int local_e8;
  int len;
  int repeat;
  int jj;
  int ii;
  char tcomment [73];
  char keyname [75];
  char **comm_local;
  int *value_local;
  int nkey_local;
  int nstart_local;
  char *keyroot_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    bVar1 = false;
    if (comm == (char **)0x0) {
      bVar1 = true;
      jj._0_1_ = 0;
    }
    else {
      sVar2 = strlen(*comm);
      local_e8 = (int)sVar2;
      while( true ) {
        bVar3 = false;
        if (0 < local_e8) {
          bVar3 = (*comm)[local_e8 + -1] == ' ';
        }
        if (!bVar3) break;
        local_e8 = local_e8 + -1;
      }
      if ((0 < local_e8) && ((*comm)[local_e8 + -1] == '&')) {
        if (local_e8 < 0x49) {
          local_f0 = local_e8;
        }
        else {
          local_f0 = 0x49;
        }
        jj._0_1_ = 0;
        strncat((char *)&jj,*comm,(long)(local_f0 + -1));
        bVar1 = true;
      }
    }
    len = nstart;
    for (repeat = 0; repeat < nkey; repeat = repeat + 1) {
      ffkeyn(keyroot,len,tcomment + 0x48,status);
      if (bVar1) {
        ffpkyl(fptr,tcomment + 0x48,value[repeat],(char *)&jj,status);
      }
      else {
        ffpkyl(fptr,tcomment + 0x48,value[repeat],comm[repeat],status);
      }
      if (0 < *status) {
        return *status;
      }
      len = len + 1;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpknl( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyroot,      /* I - root name of keywords to write       */
            int  nstart,        /* I - starting index number                */
            int  nkey,          /* I - number of keywords to write          */
            int  *value,        /* I - array of keyword values              */
            char *comm[],       /* I - array of pointers to keyword comment */
            int  *status)       /* IO - error status                        */
/*
  Write (put) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NKEY -1) inclusive.  Writes logical keywords
  Values equal to zero will be written as a False FITS keyword value; any
  other non-zero value will result in a True FITS keyword.
*/
{
    char keyname[FLEN_KEYWORD], tcomment[FLEN_COMMENT];
    int ii, jj, repeat, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check if first comment string is to be repeated for all the keywords */
    /* by looking to see if the last non-blank character is a '&' char      */

    repeat = 0;
    if (comm)
    {
      len = strlen(comm[0]);

      while (len > 0  && comm[0][len - 1] == ' ')
        len--;                               /* ignore trailing blanks */

      if (len > 0 && comm[0][len - 1] == '&')
      {
        len = minvalue(len, FLEN_COMMENT);
        tcomment[0] = '\0';
        strncat(tcomment, comm[0], len-1); /* don't copy the final '&' char */
        repeat = 1;
      }
    }
    else
    {
      repeat = 1;
      tcomment[0] = '\0';
    }


    for (ii=0, jj=nstart; ii < nkey; ii++, jj++)
    {
        ffkeyn(keyroot, jj, keyname, status);

        if (repeat)
            ffpkyl(fptr, keyname, value[ii], tcomment, status);
        else
            ffpkyl(fptr, keyname, value[ii], comm[ii], status);

        if (*status > 0)
            return(*status);
    }
    return(*status);
}